

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamtests.cc
# Opt level: O2

ktx_error_code_e anon_unknown.dwarf_5278::StreambufStream::skip(ktxStream *str,ktx_size_t count)

{
  FILE *pFVar1;
  ktx_error_code_e kVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  
  if (count != 0) {
    pFVar1 = (str->data).file;
    poVar3 = std::operator<<((ostream *)&std::cerr,"\t  skip: ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,'B');
    std::endl<char,std::char_traits<char>>(poVar3);
    lVar4 = (**(code **)(**(long **)(pFVar1 + 8) + 0x20))
                      (*(long **)(pFVar1 + 8),0,1,*(undefined4 *)(pFVar1 + 0x10));
    lVar5 = (**(code **)(**(long **)(pFVar1 + 8) + 0x20))
                      (*(long **)(pFVar1 + 8),count,1,*(undefined4 *)(pFVar1 + 0x10));
    kVar2 = KTX_FILE_SEEK_ERROR;
    if (lVar5 < lVar4) {
      kVar2 = KTX_SUCCESS;
    }
    return kVar2;
  }
  return KTX_SUCCESS;
}

Assistant:

static KTX_error_code skip(ktxStream* str, ktx_size_t count)
    {
        auto self = parent(str);
        if (count == 0)
        {
            return KTX_SUCCESS;
        }
        std::cerr << "\t  skip: " << count << 'B' << std::endl;

        const std::streampos curpos = self->_streambuf->pubseekoff(0, std::ios::cur, self->_seek_mode);
        const std::streampos newpos = self->_streambuf->pubseekoff(std::streamoff(count), std::ios::cur, self->_seek_mode);
        return (curpos > newpos) ? KTX_SUCCESS : KTX_FILE_SEEK_ERROR;
    }